

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O2

int main(void)

{
  pointer plVar1;
  int iVar2;
  char cVar3;
  istream *this;
  longlong lVar4;
  size_type __n;
  int iVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  int i;
  int x;
  long lVar9;
  int j_1;
  int j;
  long lVar10;
  char elem;
  int M;
  int N;
  allocator_type local_121;
  int local_120;
  int local_11c;
  long local_118;
  long local_110;
  long local_108;
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  table;
  Network transport;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x107180) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&N);
  std::istream::operator>>(this,&M);
  __n = (size_type)N;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&transport,(long)M,
             (allocator_type *)&elem);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector(&table,__n,(value_type *)&transport,&local_121);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&transport);
  Network::Network(&transport,M * N + 2);
  local_118 = 0;
  local_110 = 0;
  for (lVar9 = 0; uVar7 = (ulong)N, lVar9 < (long)uVar7; lVar9 = lVar9 + 1) {
    for (lVar10 = 0; lVar10 < M; lVar10 = lVar10 + 1) {
      std::operator>>((istream *)&std::cin,&elem);
      cVar3 = elem;
      lVar4 = valence(elem);
      table.
      super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9].
      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = lVar4;
      if (cVar3 != '.') {
        iVar6 = (int)lVar9;
        iVar2 = (int)lVar10;
        if ((iVar6 + iVar2 & 1U) == 0) {
          Network::add_edge(&transport,N * M,M * iVar6 + iVar2,lVar4);
          local_110 = local_110 +
                      table.
                      super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar9].
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar10];
        }
        else {
          Network::add_edge(&transport,iVar6 * M + iVar2,M * N + 1,lVar4);
          local_118 = local_118 +
                      table.
                      super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar9].
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar10];
        }
      }
    }
  }
  local_120 = 1;
  local_11c = -1;
  lVar9 = 0;
  while (lVar9 < (int)uVar7) {
    local_108 = lVar9 + 1;
    for (lVar10 = 0; iVar6 = M, lVar10 < M; lVar10 = lVar10 + 1) {
      plVar1 = table.
               super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9].
               super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((plVar1[lVar10] != -1) && (iVar2 = (int)lVar10, ((int)lVar9 + iVar2 & 1U) == 0)) {
        iVar5 = (int)lVar9 * M;
        x = iVar2 + iVar5;
        if ((iVar2 + 1 < M) && (plVar1[lVar10 + 1] != -1)) {
          Network::add_edge(&transport,x,iVar5 + 1 + iVar2,1);
        }
        if ((lVar10 != 0) &&
           (table.
            super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar9].
            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10 + -1] != -1)) {
          Network::add_edge(&transport,x,iVar5 + -1 + iVar2,1);
        }
        if ((lVar9 != 0) &&
           (table.
            super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar9 + -1].
            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] != -1)) {
          Network::add_edge(&transport,x,local_11c * iVar6 + iVar2,1);
        }
        if (((int)local_108 < N) &&
           (table.
            super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_108].
            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] != -1)) {
          Network::add_edge(&transport,x,iVar6 * local_120 + iVar2,1);
        }
      }
    }
    local_120 = local_120 + 1;
    local_11c = local_11c + 1;
    lVar9 = local_108;
    uVar7 = (ulong)(uint)N;
  }
  iVar6 = (int)uVar7 * M;
  lVar4 = Network::EdmondsKarp(&transport,iVar6,iVar6 + 1);
  pcVar8 = "Valid";
  if (local_118 == 0) {
    pcVar8 = "Invalid";
  }
  if (local_110 != local_118 || lVar4 != local_118) {
    pcVar8 = "Invalid";
  }
  std::operator<<((ostream *)&std::cout,pcVar8);
  Network::~Network(&transport);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::~vector(&table);
  return 0;
}

Assistant:

int main(){
    int N, M;
    std::ios_base::sync_with_stdio(false);
    std::cin.tie(0);
    std::cin >> N >> M;
    std::vector<std::vector<long long> > table(N, std::vector<long long>(M));
    Network transport(N * M + 2);
    long long out = 0, in = 0;
    char elem;
    for (int i = 0; i < N; ++i) { //считываем элементы
        for (int j = 0; j < M; ++j) {
            std::cin >> elem;
            table[i][j] = valence(elem);
            if(elem == '.') {
                continue;
            }
            if((i + j) % 2 == 0) {
                transport.add_edge(N * M, M * i + j, table[i][j]);
                out += table[i][j];
            } else {
                transport.add_edge(M * i + j, N * M + 1, table[i][j]);
                in += table[i][j];
            }
        }
    }
    for (int i = 0; i < N; ++i) {
        for (int j = 0; j < M; ++j) {
            if(table[i][j] == -1 || (i + j) % 2 == 1) {
                continue;
            }
            int current_vertex = i * M + j; //текущая вершина; ниже - её соседи
            int right_neighbour = i * M + j + 1;
            int left_neighbour = i * M + j - 1;
            int up_neighbour = (i - 1) * M + j;
            int down_neighbour = (i + 1) * M + j;
            if ((j + 1) < M && table[i][j + 1] != -1) {
                transport.add_edge(current_vertex, right_neighbour, 1);
            }
            if ((j - 1) >= 0 && table[i][j - 1] != -1) {
                transport.add_edge(current_vertex, left_neighbour, 1);
            }
            if ((i - 1) >= 0 && table[i - 1][j] != -1) {
                transport.add_edge(current_vertex, up_neighbour, 1);
            }
            if ((i + 1) < N && table[i + 1][j] != -1) {
                transport.add_edge(current_vertex, down_neighbour, 1);
            }
        }
    }
    long long throughput = transport.EdmondsKarp(N * M, N * M + 1);
    if (throughput == in && throughput == out && throughput != 0){
        std::cout << "Valid";
    } else {
        std::cout << "Invalid";
    }
    return 0;
}